

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_step_sync(void)

{
  char *__nptr;
  undefined1 auVar1 [16];
  char *cfg_ptr;
  double freq_default;
  double freq_range [2];
  char local_d [8];
  char freq_token [5];
  
  builtin_strncpy(local_d,"freq",5);
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav->t = 0.0;
      fsnav_ins_step_sync::i = 0;
      __nptr = fsnav_locate_token(local_d,fsnav->imu->cfg,fsnav->imu->cfglength,'=');
      if (((__nptr == (char *)0x0) ||
          (fsnav_ins_step_sync::dt = atof(__nptr), fsnav_ins_step_sync::dt < 50.0)) ||
         (3200.0 < fsnav_ins_step_sync::dt)) {
        fsnav_ins_step_sync::dt = 100.0;
      }
      fsnav_ins_step_sync::dt = 1.0 / fsnav_ins_step_sync::dt;
    }
    else if (-1 < fsnav->mode) {
      fsnav->imu->w_valid = '\0';
      fsnav->imu->f_valid = '\0';
      fsnav_ins_step_sync::i = fsnav_ins_step_sync::i + 1;
      auVar1._8_4_ = (int)(fsnav_ins_step_sync::i >> 0x20);
      auVar1._0_8_ = fsnav_ins_step_sync::i;
      auVar1._12_4_ = 0x45300000;
      fsnav->imu->t =
           ((auVar1._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)fsnav_ins_step_sync::i) - 4503599627370496.0)) *
           fsnav_ins_step_sync::dt;
    }
  }
  return;
}

Assistant:

void fsnav_ins_step_sync(void) 
{
	const char   freq_token[] = "freq";     // имя параметра в строке конфигурации, содержащего частоту
	const double freq_range[] = {50, 3200}; // диапазон допустимых частот
	const double freq_default = 100;        // частота по умолчанию

	static double        dt   = -1;         // шаг по времени
	static unsigned long i    =  0;         // номер шага

	char *cfg_ptr;                          // указатель на строку конфигурации

	// проверка инициализации инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// начальные значения
		fsnav->t = 0;
		i = 0;
		// поиск значения частоты в конфигурации
		cfg_ptr = fsnav_locate_token(freq_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			dt = atof(cfg_ptr);	
		// если значение не найдено в конфигурации, или значение вне заданных пределов, установка по умолчанию
		if (cfg_ptr == NULL || dt < freq_range[0] || freq_range[1] < dt)
			dt = freq_default;
		// вычисление шага по времени
		dt = 1 / dt;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// шаг основного цикла	
	else {
		// сброс достоверности инерциальных датчиков
		fsnav->imu->w_valid = 0;
		fsnav->imu->f_valid = 0;
		// шаг по времени
		i++;
		fsnav->imu->t = i*dt;
	}
}